

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void addStaticRoot(object **objp)

{
  long *plVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = 0;
  if (0 < staticRootTop) {
    uVar3 = (ulong)(uint)staticRootTop;
  }
  lVar2 = 0;
  do {
    if (uVar3 * 8 == lVar2) {
      if (199 < staticRootTop) {
        error_impl("addStaticRoot",0x189,
                   "addStaticRoot(): too many static references (max %d) to store object %p!",200,
                   objp);
      }
      lVar2 = (long)staticRootTop;
      staticRootTop = staticRootTop + 1;
      staticRoots[lVar2] = objp;
      return;
    }
    plVar1 = (long *)((long)staticRoots + lVar2);
    lVar2 = lVar2 + 8;
  } while ((object **)*plVar1 != objp);
  return;
}

Assistant:

void addStaticRoot(struct object **objp)
{
    int i;

    for (i = 0; i < staticRootTop; ++i) {
        if (objp == staticRoots[i]) {
            return;
        }
    }
    if (staticRootTop >= STATICROOTLIMIT) {
        error("addStaticRoot(): too many static references (max %d) to store object %p!", STATICROOTLIMIT, objp);
    }
    staticRoots[staticRootTop++] = objp;
}